

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::runQueryProgram
          (ExplicitUniformLocationCaseBase *this,CompiledProgram *program,
          vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          *uniforms,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms)

{
  GLenum GVar1;
  GLint max_00;
  bool bVar2;
  size_type sVar3;
  const_reference uniform;
  ulong uVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  const_reference subroutineFunction;
  byte local_151;
  ulong local_100;
  size_t fn;
  size_t i_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> usedIndices;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> usedLocations_1;
  size_t stage;
  GLint maxIndex;
  GLint maxLocation;
  size_t i;
  GLint local_64;
  undefined1 local_60 [4];
  GLint max;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> usedLocations;
  long ret;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  *uniforms_local;
  CompiledProgram *program_local;
  ExplicitUniformLocationCaseBase *this_local;
  
  usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_60);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x826e,&local_64);
  for (_maxIndex = 0; uVar4 = _maxIndex,
      sVar3 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::size(uniforms), uVar4 < sVar3; _maxIndex = _maxIndex + 1) {
    uniform = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::operator[](uniforms,_maxIndex);
    uVar4 = runQueryUniform(this,program,uniform,
                            (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_60,local_64);
    usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count =
         uVar4 | usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_60);
  sVar3 = std::
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          ::size(subroutineUniforms);
  if (sVar3 != 0) {
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8de8,
               (GLint *)((long)&stage + 4));
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8de7,
               (GLint *)&stage);
    for (usedLocations_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&program->stages),
        usedLocations_1._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar3;
        usedLocations_1._M_t._M_impl.super__Rb_tree_header._M_node_count =
             usedLocations_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &usedIndices._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&i_1);
      for (fn = 0; sVar3 = std::
                           vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                           ::size(subroutineUniforms), fn < sVar3; fn = fn + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&program->stages,
                            usedLocations_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
        GVar1 = *pvVar5;
        pvVar6 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 ::operator[](subroutineUniforms,fn);
        uVar4 = runQueryUniformSubroutine
                          (this,program,GVar1,pvVar6,
                           (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&usedIndices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           stage._4_4_);
        usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count =
             uVar4 | usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_100 = 0;
        while( true ) {
          pvVar6 = std::
                   vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                   ::operator[](subroutineUniforms,fn);
          sVar3 = std::
                  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                  ::size((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                          *)pvVar6);
          if (sVar3 <= local_100) break;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&program->stages,
                              usedLocations_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
          GVar1 = *pvVar5;
          pvVar6 = std::
                   vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                   ::operator[](subroutineUniforms,fn);
          subroutineFunction =
               std::
               vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ::operator[]((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                             *)pvVar6,local_100);
          max_00 = (GLint)stage;
          pvVar6 = std::
                   vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                   ::operator[](subroutineUniforms,fn);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&program->stages,
                              usedLocations_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar2 = DefOccurence::occurs(&pvVar6->defOccurence,*pvVar5);
          local_151 = 0;
          if (bVar2) {
            pvVar6 = std::
                     vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                     ::operator[](subroutineUniforms,fn);
            local_151 = pvVar6->used;
          }
          uVar4 = runQueryUniformSubroutineFunction
                            (this,program,GVar1,subroutineFunction,
                             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&i_1,max_00,(bool)(local_151 & 1));
          usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count =
               uVar4 | usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_100 = local_100 + 1;
        }
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&i_1);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &usedIndices._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  return usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

long runQueryProgram(const CompiledProgram& program, const std::vector<Uniform>& uniforms,
						 const std::vector<SubroutineUniform>& subroutineUniforms)
	{
		long ret = NO_ERROR;

		{
			std::set<GLuint> usedLocations;

			GLint max;
			glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);

			for (size_t i = 0; i < uniforms.size(); i++)
			{
				ret |= runQueryUniform(program, uniforms[i], usedLocations, max);
			}
		}

		if (subroutineUniforms.size())
		{
			GLint maxLocation, maxIndex;
			glGetIntegerv(GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS, &maxLocation);
			glGetIntegerv(GL_MAX_SUBROUTINES, &maxIndex);

			for (size_t stage = 0; stage < program.stages.size(); stage++)
			{
				std::set<GLuint> usedLocations;
				std::set<GLuint> usedIndices;
				for (size_t i = 0; i < subroutineUniforms.size(); i++)
				{
					ret |= runQueryUniformSubroutine(program, program.stages[stage], subroutineUniforms[i],
													 usedLocations, maxLocation);
					for (size_t fn = 0; fn < subroutineUniforms[i].functions.fn.size(); fn++)
					{
						ret |= runQueryUniformSubroutineFunction(
							program, program.stages[stage], subroutineUniforms[i].functions.fn[fn], usedIndices,
							maxIndex,
							subroutineUniforms[i].defOccurence.occurs(program.stages[stage]) &&
								subroutineUniforms[i].used);
					}
				}
			}
		}

		return ret;
	}